

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O0

int __thiscall
SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
::Decode(SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
         *this,int max_count,uint64_t *out)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  uint64_t *in_RDX;
  int in_ESI;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_RDI;
  long in_FS_OFFSET;
  uint *root;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  iterator __end0;
  iterator __begin0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roots;
  vector<unsigned_int,_std::allocator<unsigned_int>_> poly;
  vector<unsigned_int,_std::allocator<unsigned_int>_> all_syndromes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  Elem in_stack_ffffffffffffff24;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *in_stack_ffffffffffffff28;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint64_t *local_80;
  int local_64;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *in_stack_ffffffffffffffc0;
  uint local_38;
  Elem in_stack_ffffffffffffffcc;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ReconstructAllSyndromes<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  BerlekampMassey<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_stack_ffffffffffffff18);
  if (sVar3 == 0) {
    local_64 = -1;
  }
  else {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (in_stack_ffffffffffffff18);
    if (sVar3 == 1) {
      local_64 = 0;
    }
    else {
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (in_stack_ffffffffffffff18);
      if (in_ESI + 1 < (int)sVar3) {
        local_64 = -1;
      }
      else {
        __last._M_current = &local_38;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        std::
        reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  (in_RDI,__last);
        FindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffd0,
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
        sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          (in_stack_ffffffffffffff18);
        if (sVar3 == 0) {
          local_64 = -1;
        }
        else {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          local_80 = in_RDX;
          while( true ) {
            bVar2 = __gnu_cxx::
                    operator==<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)in_stack_ffffffffffffff28,
                               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
            if (((bVar2 ^ 0xffU) & 1) == 0) break;
            __gnu_cxx::
            __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         *)in_stack_ffffffffffffff18);
            in_stack_ffffffffffffff28 =
                 (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                  *)anon_unknown.dwarf_250df77::
                    Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                    ::ToUint64(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
            *local_80 = (uint64_t)in_stack_ffffffffffffff28;
            __gnu_cxx::
            __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)in_stack_ffffffffffffff18);
            local_80 = local_80 + 1;
          }
          sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            (in_stack_ffffffffffffff18);
          local_64 = (int)sVar3;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff28)
        ;
      }
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_64;
  }
  __stack_chk_fail();
}

Assistant:

int Decode(int max_count, uint64_t* out) const override
    {
        auto all_syndromes = ReconstructAllSyndromes(m_syndromes, m_field);
        auto poly = BerlekampMassey(all_syndromes, max_count, m_field);
        if (poly.size() == 0) return -1;
        if (poly.size() == 1) return 0;
        if ((int)poly.size() > 1 + max_count) return -1;
        std::reverse(poly.begin(), poly.end());
        auto roots = FindRoots(poly, m_basis, m_field);
        if (roots.size() == 0) return -1;

        for (const auto& root : roots) {
            *(out++) = m_field.ToUint64(root);
        }
        return static_cast<int>(roots.size());
    }